

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O2

void __thiscall sf::Transformable::rotate(Transformable *this,float angle)

{
  setRotation(this,angle + this->m_rotation);
  return;
}

Assistant:

void Transformable::rotate(float angle)
{
    setRotation(m_rotation + angle);
}